

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabSet.cpp
# Opt level: O0

FabSet * __thiscall
amrex::FabSet::linComb
          (FabSet *this,Real a,MultiFab *mfa,int a_comp,Real b,MultiFab *mfb,int b_comp,int dcomp,
          int ncomp,int ngrow)

{
  bool bVar1;
  FabArray<amrex::FArrayBox> *this_00;
  MFIter *mfi_00;
  FabSet *in_RDI;
  int in_R9D;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  int in_stack_00000008;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  Array4<double> dfab;
  Array4<double> bfab_1;
  Array4<double> afab_1;
  Box *bx_1;
  FabSetIter fsi;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Real huge;
  Array4<double> bfab;
  Array4<double> afab;
  Box *bx;
  MFIter mfi;
  MultiFab bdryb;
  MultiFab bdrya;
  FabArray<amrex::FArrayBox> *pFVar2;
  ulong uVar3;
  MFIter *mfi_01;
  MFIter *in_stack_fffffffffffff6d0;
  undefined4 in_stack_fffffffffffff6d8;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffff6dc;
  MFIter *in_stack_fffffffffffff6e0;
  MFIter *this_01;
  MFInfo *in_stack_fffffffffffff6f0;
  uchar flags_;
  int in_stack_fffffffffffff6f8;
  int in_stack_fffffffffffff6fc;
  undefined4 in_stack_fffffffffffff700;
  undefined4 in_stack_fffffffffffff704;
  BoxArray *in_stack_fffffffffffff708;
  undefined4 in_stack_fffffffffffff710;
  undefined4 in_stack_fffffffffffff714;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffff720;
  MFIter *in_stack_fffffffffffff728;
  FabArray<amrex::FArrayBox> *src;
  int iVar5;
  BoxArray *pBVar6;
  CpOp op;
  undefined8 *puVar7;
  int local_878;
  int local_874;
  int local_870;
  int local_86c;
  long local_828;
  long local_820;
  long local_818;
  long local_810;
  int local_808;
  int local_804;
  int local_800;
  long local_7e8;
  long local_7e0;
  long local_7d8;
  long local_7d0;
  int local_7c8;
  int local_7c4;
  int local_7c0;
  long local_7a8;
  long local_7a0;
  long local_798;
  long local_790;
  int local_788;
  int local_784;
  int local_780;
  undefined1 local_764 [36];
  MFIter local_740;
  int local_6e0;
  int local_6dc;
  int local_6d8;
  int local_6d4;
  undefined8 local_6d0;
  int local_6c8;
  undefined8 local_6bc;
  int local_6b4;
  _func_int **local_6b0;
  int local_6a8;
  _func_int **local_6a0;
  int local_698;
  undefined8 local_690;
  long local_688;
  long local_680;
  long local_678;
  long local_670;
  int local_668;
  int local_664;
  int local_660;
  long local_648;
  long local_640;
  long local_638;
  long local_630;
  int local_628;
  int local_624;
  int local_620;
  FabFactory<amrex::FArrayBox> local_604 [3];
  FabFactory<amrex::FArrayBox> *local_5e8;
  MFIter local_5e0;
  FabArray<amrex::FArrayBox> local_580;
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  int local_210;
  double local_200;
  double local_1e8;
  FabArrayBase *local_1d8;
  int local_1d0;
  MFIter *local_1c8;
  int local_1bc;
  int iStack_1b8;
  int local_1b4;
  _func_int **local_1b0;
  int local_1a8;
  FabFactory<amrex::FArrayBox> *local_1a0;
  int local_194;
  int iStack_190;
  int local_18c;
  undefined8 local_188;
  int local_180;
  MFIter *local_178;
  int local_16c;
  int iStack_168;
  int local_164;
  undefined8 local_160;
  int local_158;
  FabFactory<amrex::FArrayBox> *local_150;
  int local_144;
  int iStack_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  long *local_128;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  long *local_110;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  long *local_f8;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  long *local_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  long *local_c8;
  undefined4 local_bc;
  undefined1 *local_b8;
  undefined4 local_ac;
  undefined1 *local_a8;
  undefined4 local_9c;
  int *local_98;
  undefined4 local_8c;
  undefined1 *local_88;
  undefined4 local_7c;
  undefined1 *local_78;
  undefined4 local_6c;
  int *local_68;
  undefined4 local_5c;
  FabFactory<amrex::FArrayBox> *local_58;
  undefined4 local_4c;
  FabFactory<amrex::FArrayBox> *local_48;
  undefined4 local_3c;
  FabFactory<amrex::FArrayBox> *local_38;
  undefined4 local_2c;
  MFIter *local_28;
  undefined4 local_1c;
  MFIter *local_18;
  undefined4 local_c;
  MFIter *local_8;
  
  local_1e8 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_210 = in_R9D;
  local_200 = in_XMM1_Qa;
  boxArray((FabSet *)0x1052e4b);
  DistributionMap((FabSet *)0x1052e60);
  local_3a8 = 0;
  uStack_3a0 = 0;
  local_3b8 = 0;
  uStack_3b0 = 0;
  local_398 = 0;
  MFInfo::MFInfo((MFInfo *)0x1052eaa);
  local_3c0 = 0;
  puVar7 = &local_3c0;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff6d0);
  MultiFab::MultiFab((MultiFab *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                     in_stack_fffffffffffff708,
                     (DistributionMapping *)
                     CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
                     in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0,
                     in_stack_fffffffffffff720);
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x1052f17);
  MFInfo::~MFInfo((MFInfo *)0x1052f24);
  this_00 = (FabArray<amrex::FArrayBox> *)boxArray((FabSet *)0x1052f31);
  DistributionMap((FabSet *)0x1052f43);
  local_580.super_FabArrayBase.boxarray.m_bat.m_op._12_8_ = 0;
  local_580.super_FabArrayBase.boxarray.m_bat.m_op._20_8_ = 0;
  local_580.super_FabArrayBase.boxarray.m_bat._0_8_ = 0;
  local_580.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ = 0;
  local_580.super_FabArrayBase.boxarray.m_bat.m_op._28_8_ = 0;
  pBVar6 = &local_580.super_FabArrayBase.boxarray;
  MFInfo::MFInfo((MFInfo *)0x1052f8a);
  local_580.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x0;
  pFVar2 = &local_580;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffff6d0);
  src = pFVar2;
  MultiFab::MultiFab((MultiFab *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                     in_stack_fffffffffffff708,
                     (DistributionMapping *)
                     CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
                     in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0,
                     in_stack_fffffffffffff720);
  flags_ = (uchar)((ulong)in_stack_fffffffffffff6f0 >> 0x38);
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x1052feb);
  MFInfo::~MFInfo((MFInfo *)0x1052ff8);
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffff704,in_stack_fffffffffffff700),
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
                 flags_);
  while( true ) {
    bVar1 = MFIter::isValid(&local_5e0);
    op = (CpOp)puVar7;
    iVar5 = (int)pBVar6;
    if (!bVar1) break;
    in_stack_fffffffffffff720 = local_604;
    in_stack_fffffffffffff728 = &local_5e0;
    MFIter::validbox(in_stack_fffffffffffff6e0);
    local_5e8 = in_stack_fffffffffffff720;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
               in_stack_fffffffffffff6d0);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
               in_stack_fffffffffffff6d0);
    local_690 = 0x6974e718d7d7625a;
    local_1a0 = local_5e8;
    local_38 = local_5e8;
    local_3c = 0;
    local_194 = *(int *)&local_5e8->_vptr_FabFactory;
    local_48 = local_5e8;
    local_4c = 1;
    iStack_190 = *(int *)((long)&local_5e8->_vptr_FabFactory + 4);
    local_6b0 = local_5e8->_vptr_FabFactory;
    local_58 = local_5e8;
    local_5c = 2;
    local_6a8 = *(int *)&local_5e8[1]._vptr_FabFactory;
    local_150 = local_5e8;
    local_98 = (int *)((long)&local_5e8[1]._vptr_FabFactory + 4);
    local_9c = 0;
    local_144 = *local_98;
    local_a8 = (undefined1 *)((long)&local_5e8[1]._vptr_FabFactory + 4);
    local_ac = 1;
    iStack_140 = *(int *)&local_5e8[2]._vptr_FabFactory;
    local_6d0 = *(undefined8 *)local_98;
    local_b8 = (undefined1 *)((long)&local_5e8[1]._vptr_FabFactory + 4);
    local_bc = 2;
    local_6c8 = *(int *)((long)&local_5e8[2]._vptr_FabFactory + 4);
    for (local_6d4 = 0; iVar5 = local_6a8, local_6d4 < in_stack_00000008; local_6d4 = local_6d4 + 1)
    {
      while (local_6d8 = iVar5, iVar5 = iStack_190, local_6d8 <= local_6c8) {
        while (local_6dc = iVar5, iVar5 = local_194, local_6dc <= iStack_140) {
          while (local_6e0 = iVar5, local_6e0 <= local_144) {
            local_cc = local_6e0;
            local_d0 = local_6dc;
            local_d4 = local_6d8;
            local_d8 = local_6d4;
            local_c8 = &local_648;
            *(undefined8 *)
             (local_648 +
             ((long)(local_6e0 - local_628) + (local_6dc - local_624) * local_640 +
              (local_6d8 - local_620) * local_638 + local_6d4 * local_630) * 8) = 0x6974e718d7d7625a
            ;
            local_e4 = local_6e0;
            local_e8 = local_6dc;
            local_ec = local_6d8;
            local_f0 = local_6d4;
            local_e0 = &local_688;
            *(undefined8 *)
             (local_688 +
             ((long)(local_6e0 - local_668) + (local_6dc - local_664) * local_680 +
              (local_6d8 - local_660) * local_678 + local_6d4 * local_670) * 8) = 0x6974e718d7d7625a
            ;
            iVar5 = local_6e0 + 1;
          }
          iVar5 = local_6dc + 1;
        }
        iVar5 = local_6d8 + 1;
      }
    }
    local_6bc = local_6d0;
    local_6b4 = local_6c8;
    local_6a0 = local_6b0;
    local_698 = local_6a8;
    local_1b0 = local_6b0;
    local_1a8 = local_6a8;
    local_18c = local_6a8;
    local_160 = local_6d0;
    local_158 = local_6c8;
    local_13c = local_6c8;
    MFIter::operator++(&local_5e0);
  }
  MFIter::~MFIter(in_stack_fffffffffffff6d0);
  Periodicity::NonPeriodic();
  uVar3 = (ulong)pFVar2 & 0xffffffff00000000;
  FabArray<amrex::FArrayBox>::ParallelCopy
            (this_00,src,(int)((ulong)in_stack_fffffffffffff728 >> 0x20),
             (int)in_stack_fffffffffffff728,(int)((ulong)in_stack_fffffffffffff720 >> 0x20),
             (int)in_stack_fffffffffffff720,iVar5,(Periodicity *)in_RDI,op);
  mfi_00 = (MFIter *)Periodicity::NonPeriodic();
  uVar4 = 0;
  mfi_01 = (MFIter *)(uVar3 & 0xffffffff00000000);
  FabArray<amrex::FArrayBox>::ParallelCopy
            (this_00,src,(int)((ulong)in_stack_fffffffffffff728 >> 0x20),
             (int)in_stack_fffffffffffff728,(int)((ulong)in_stack_fffffffffffff720 >> 0x20),
             (int)in_stack_fffffffffffff720,iVar5,(Periodicity *)in_RDI,op);
  FabSetIter::FabSetIter((FabSetIter *)mfi_00,(FabSet *)mfi_01);
  while (bVar1 = MFIter::isValid(&local_740), bVar1) {
    this_01 = (MFIter *)local_764;
    MFIter::validbox(this_01);
    local_764._28_8_ = this_01;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)CONCAT44(in_stack_fffffffffffff6dc,uVar4),mfi_00);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)CONCAT44(in_stack_fffffffffffff6dc,uVar4),mfi_00);
    array((FabSet *)mfi_00,mfi_01);
    local_1c8 = (MFIter *)local_764._28_8_;
    local_8 = (MFIter *)local_764._28_8_;
    local_c = 0;
    local_1bc = *(int *)&(((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                            *)local_764._28_8_)->_M_t).
                         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                         .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
    local_18 = (MFIter *)local_764._28_8_;
    local_1c = 1;
    iStack_1b8 = *(int *)((long)&(((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                    *)local_764._28_8_)->_M_t).
                                 super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                 .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl +
                         4);
    local_1d8 = (((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *)
                 local_764._28_8_)->_M_t).
                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                ._M_t.
                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
    local_28 = (MFIter *)local_764._28_8_;
    local_2c = 2;
    local_1d0 = *(int *)(local_764._28_8_ + 8);
    local_178 = (MFIter *)local_764._28_8_;
    local_68 = (int *)((long)(local_764._28_8_ + 8) + 4);
    local_6c = 0;
    local_16c = *local_68;
    local_78 = (undefined1 *)((long)(local_764._28_8_ + 8) + 4);
    local_7c = 1;
    iStack_168 = ((IntVect *)(local_764._28_8_ + 0x10))->vect[0];
    local_188 = *(undefined8 *)local_68;
    local_88 = (undefined1 *)((long)(local_764._28_8_ + 8) + 4);
    local_8c = 2;
    local_180 = ((IntVect *)(local_764._28_8_ + 0x10))->vect[1];
    for (local_86c = 0; local_870 = local_1d0, local_86c < in_stack_00000008;
        local_86c = local_86c + 1) {
      for (; local_874 = iStack_1b8, local_870 <= local_180; local_870 = local_870 + 1) {
        for (; local_878 = local_1bc, local_874 <= iStack_168; local_874 = local_874 + 1) {
          for (; local_878 <= local_16c; local_878 = local_878 + 1) {
            local_fc = local_878;
            local_100 = local_874;
            local_104 = local_870;
            local_108 = local_86c;
            local_f8 = &local_7a8;
            local_114 = local_878;
            local_118 = local_874;
            local_11c = local_870;
            local_120 = local_86c;
            local_110 = &local_7e8;
            local_12c = local_878;
            local_130 = local_874;
            local_134 = local_870;
            local_138 = local_86c + local_210;
            local_128 = &local_828;
            *(double *)
             (local_828 +
             ((long)(local_878 - local_808) + (local_874 - local_804) * local_820 +
              (local_870 - local_800) * local_818 + local_138 * local_810) * 8) =
                 local_1e8 *
                 *(double *)
                  (local_7a8 +
                  ((long)(local_878 - local_788) + (local_874 - local_784) * local_7a0 +
                   (local_870 - local_780) * local_798 + local_86c * local_790) * 8) +
                 local_200 *
                 *(double *)
                  (local_7e8 +
                  ((long)(local_878 - local_7c8) + (local_874 - local_7c4) * local_7e0 +
                   (local_870 - local_7c0) * local_7d8 + local_86c * local_7d0) * 8);
          }
        }
      }
    }
    local_1b4 = local_1d0;
    local_164 = local_180;
    MFIter::operator++(&local_740);
  }
  FabSetIter::~FabSetIter((FabSetIter *)0x10536ae);
  MultiFab::~MultiFab((MultiFab *)0x1053c4d);
  MultiFab::~MultiFab((MultiFab *)0x1053c5a);
  return in_RDI;
}

Assistant:

FabSet&
FabSet::linComb (Real a, const MultiFab& mfa, int a_comp,
                 Real b, const MultiFab& mfb, int b_comp,
                 int dcomp, int ncomp, int ngrow)
{
    BL_PROFILE("FabSet::linComb()");
    BL_ASSERT(ngrow <= mfa.nGrow());
    BL_ASSERT(ngrow <= mfb.nGrow());
    BL_ASSERT(mfa.boxArray() == mfb.boxArray());
    BL_ASSERT(boxArray() != mfa.boxArray());

    MultiFab bdrya(boxArray(),DistributionMap(),ncomp,0,MFInfo(),FArrayBoxFactory());
    MultiFab bdryb(boxArray(),DistributionMap(),ncomp,0,MFInfo(),FArrayBoxFactory());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(bdrya); mfi.isValid(); ++mfi) // tiling is not safe for this BoxArray
    {
        const Box& bx = mfi.validbox();
        auto afab = bdrya.array(mfi);
        auto bfab = bdryb.array(mfi);
#ifdef AMREX_USE_FLOAT
        const Real huge = 1.e30f;
#else
        const Real huge = 1.e200;
#endif
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
        {
            afab(i,j,k,n) = huge;
            bfab(i,j,k,n) = huge;
        });
    }

    bdrya.ParallelCopy(mfa,a_comp,0,ncomp,ngrow,0);
    bdryb.ParallelCopy(mfb,b_comp,0,ncomp,ngrow,0);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (FabSetIter fsi(*this); fsi.isValid(); ++fsi)
    {
        const Box& bx = fsi.validbox();
        auto const afab = bdrya.array(fsi);
        auto const bfab = bdryb.array(fsi);
        auto       dfab = this->array(fsi);
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
        {
            dfab(i,j,k,n+dcomp) = a*afab(i,j,k,n) + b*bfab(i,j,k,n);
        });
    }

    return *this;
}